

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

bool __thiscall qclab::qgates::CZ<double>::equals(CZ<double> *this,QObject<double> *other)

{
  int iVar1;
  int iVar2;
  bool local_51;
  QControlledGate2<double> *local_40;
  CG *p;
  QObject<double> *other_local;
  CZ<double> *this_local;
  
  if (other == (QObject<double> *)0x0) {
    local_40 = (QControlledGate2<double> *)0x0;
  }
  else {
    local_40 = (QControlledGate2<double> *)
               __dynamic_cast(other,&QObject<double>::typeinfo,&typeinfo,0);
  }
  if (local_40 != (QControlledGate2<double> *)0x0) {
    iVar1 = QControlledGate2<double>::controlState(local_40);
    iVar2 = QControlledGate2<double>::controlState(&this->super_QControlledGate2<double>);
    if (iVar1 != iVar2) {
      return false;
    }
    iVar1 = QControlledGate2<double>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      iVar1 = QControlledGate2<double>::control(&this->super_QControlledGate2<double>);
      iVar2 = (*(this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>.
                _vptr_QObject[0xf])();
      if (iVar1 < iVar2) {
        return true;
      }
    }
    iVar1 = QControlledGate2<double>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    local_51 = false;
    if (iVar2 < iVar1) {
      iVar1 = QControlledGate2<double>::control(&this->super_QControlledGate2<double>);
      iVar2 = (*(this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>.
                _vptr_QObject[0xf])();
      local_51 = iVar2 < iVar1;
    }
    return local_51;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CZ< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }